

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O3

void __thiscall
Script_Script_bytedata_Test::~Script_Script_bytedata_Test(Script_Script_bytedata_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, Script_bytedata) {
  size_t size = 5;
  ByteData bytedata("76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac");
  Script script(bytedata);
  EXPECT_STREQ(script.GetHex().c_str(),
               "76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac");
  EXPECT_EQ(script.IsEmpty(), false);
  EXPECT_EQ(script.GetElementList().size(), size);
}